

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::FramebufferRenderCase::iterate(FramebufferRenderCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  FramebufferRenderCase *this_local;
  
  pRVar2 = Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  if (this->m_fboID != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x78))(0x8d40,this->m_fboID);
  }
  (*(this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7])();
  return STOP;
}

Assistant:

FramebufferRenderCase::IterateResult FramebufferRenderCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// bind fbo (or don't if we are using default)
	if (m_fboID)
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fboID);

	// do something with special floats
	testFBO();

	return STOP;
}